

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_str(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  undefined2 *puVar2;
  long *local_68;
  char local_60;
  undefined1 local_58 [8];
  long *local_50;
  Value local_48;
  anon_union_8_3_2f476f46_for_data local_38;
  anon_union_8_3_2f476f46_for_data local_30 [3];
  
  local_60 = '\0';
  plVar1 = (long *)operator_new(0x30);
  plVar1[1] = 1;
  *plVar1 = (long)&PTR__StringStorage_001d10b0;
  plVar1[3] = 2;
  plVar1[4] = -1;
  puVar2 = (undefined2 *)operator_new__(2);
  plVar1[2] = (long)puVar2;
  *puVar2 = 0;
  *puVar2 = 0x78;
  local_68 = plVar1;
  Context::GetVar((Context *)local_58,(String *)partialResult.rs,(LocalOnlyMode)&local_68);
  Value::ToString((Value *)&local_38,(Machine *)local_58);
  local_48.type = String;
  local_48.noInvoke = false;
  local_48.localOnly = Off;
  local_48.data = local_38;
  if (local_38.ref == (RefCountedStorage *)0x0) {
    local_48.data = DAT_001d3308;
  }
  if (local_48.data.ref != (RefCountedStorage *)0x0) {
    (local_48.data.ref)->refCount = (local_48.data.ref)->refCount + 1;
  }
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_48);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_48.type) && (local_48.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_48.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_48.data.ref)->_vptr_RefCountedStorage[1])();
    }
    local_48.data.number = 0.0;
  }
  if ((local_38.ref != (RefCountedStorage *)0x0) && ((bool)local_30[0]._0_1_ == false)) {
    plVar1 = &(local_38.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_38.ref)->_vptr_RefCountedStorage[1])();
    }
    local_38.number = 0.0;
  }
  if ((2 < local_58[0]) && (local_50 != (long *)0x0)) {
    plVar1 = local_50 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*local_50 + 8))();
    }
    local_50 = (long *)0x0;
  }
  if ((local_68 != (long *)0x0) && (local_60 == '\0')) {
    plVar1 = local_68 + 1;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (**(code **)(*local_68 + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_str(Context *context, IntrinsicResult partialResult) {
		return IntrinsicResult(context->GetVar("x").ToString());
	}